

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seqdiff.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  anon_class_16_2_e7935f5f __f;
  anon_class_16_2_e7935f5f __f_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  __last_00;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  __last_01;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  unsigned_long uVar6;
  ostream *poVar7;
  ulong uVar8;
  sequence_gap_structure *psVar9;
  Vector *pVVar10;
  type *ptVar11;
  type *ptVar12;
  ulong *puVar13;
  size_type sVar14;
  size_type sVar15;
  reference ppVVar16;
  long diff;
  size_type sVar17;
  type *ptVar18;
  type_conflict *ptVar19;
  undefined8 uVar20;
  uint uVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  pair<std::_Rb_tree_iterator<std::pair<Vector_*const,_long>_>,_bool> pVar26;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_bool>
  pVar27;
  bool comma;
  iterator mutation_string;
  type value_1;
  long index;
  bool did_insert_1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_bool>
  intert_result_1;
  uint character;
  long position;
  string mut;
  long i;
  vector<long,_std::allocator<long>_> recoded;
  Vector *p;
  iterator __end3;
  iterator __begin3;
  vector<Vector_*,_std::allocator<Vector_*>_> *__range3;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  recoded_patterns;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique_differences;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  differences_map;
  vector<long,_std::allocator<long>_> new_vector;
  type value;
  long my_code;
  bool did_insert;
  pair<std::_Rb_tree_iterator<std::pair<Vector_*const,_long>_>,_bool> intert_result;
  char *seq_data;
  Vector *differences;
  long seq_id;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  copies;
  vector<Vector_*,_std::allocator<Vector_*>_> patterns;
  vector<long,_std::allocator<long>_> assignments;
  map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
  pattern_map;
  sequence_gap_structure *ref_gaps;
  char *ref_seq;
  char *ref_name;
  time_t after;
  time_t before;
  int resolutionOption;
  unsigned_long sid;
  double percentDone;
  sequence_gap_structure *sequence_descriptors;
  unsigned_long sequenceCount;
  char automatonState;
  long firstSequenceLength;
  args_t args;
  sequence_gap_structure *this;
  anon_class_8_1_89897ddb __f_01;
  undefined4 uVar28;
  int in_stack_fffffffffffffa54;
  long in_stack_fffffffffffffa58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 uVar29;
  undefined4 in_stack_fffffffffffffa64;
  undefined2 in_stack_fffffffffffffa6c;
  undefined1 in_stack_fffffffffffffa6e;
  undefined1 in_stack_fffffffffffffa6f;
  undefined7 in_stack_fffffffffffffa70;
  undefined1 in_stack_fffffffffffffa77;
  char *in_stack_fffffffffffffa78;
  char *in_stack_fffffffffffffa80;
  unsigned_long in_stack_fffffffffffffa90;
  sequence_gap_structure *in_stack_fffffffffffffa98;
  Vector *in_stack_fffffffffffffaa0;
  undefined8 in_stack_fffffffffffffaa8;
  unsigned_long in_stack_fffffffffffffab0;
  FILE *__stream;
  undefined7 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffabf;
  char *in_stack_fffffffffffffac0;
  sequence_gap_structure *in_stack_fffffffffffffad0;
  sequence_gap_structure *local_420;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_338;
  _Base_ptr local_330;
  long local_328;
  byte local_319;
  _Base_ptr local_318;
  undefined1 local_310;
  size_type local_308;
  _Base_ptr local_2d8;
  undefined1 local_2d0;
  string local_2c8 [7];
  undefined1 in_stack_fffffffffffffd3f;
  double in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd4f;
  Vector *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  uint in_stack_fffffffffffffd5c;
  StringBuffer *in_stack_fffffffffffffd60;
  StringBuffer *in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  FILE *in_stack_fffffffffffffd78;
  ulong local_278;
  long *in_stack_fffffffffffffd90;
  Vector *in_stack_fffffffffffffda0;
  char in_stack_fffffffffffffda8;
  __normal_iterator<Vector_**,_std::vector<Vector_*,_std::allocator<Vector_*>_>_> local_248;
  undefined1 *local_240;
  long local_1c0;
  _Base_ptr local_1b8;
  ulong local_1b0;
  byte local_1a1;
  _Base_ptr local_1a0;
  undefined1 local_198;
  size_type local_190;
  pair<Vector_*const,_long> local_188;
  _Base_ptr local_178;
  undefined1 local_170;
  char *local_168;
  Vector *local_160;
  int local_154;
  int local_150;
  int local_14c;
  ulong local_148;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_140;
  undefined1 local_128 [96];
  sequence_gap_structure *local_c8;
  char *local_c0;
  char *local_b8;
  time_t local_b0;
  time_t local_a8;
  undefined4 local_9c;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  ulong local_78;
  double local_70;
  sequence_gap_structure *local_68;
  ulong local_60;
  undefined4 local_58;
  undefined1 local_41;
  sequence_gap_structure local_40;
  int local_20;
  int local_1c;
  byte local_18;
  byte local_17;
  int local_4;
  
  local_4 = 0;
  argparse::args_t::args_t
            ((args_t *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
             CONCAT13(in_stack_fffffffffffffa6f,
                      CONCAT12(in_stack_fffffffffffffa6e,in_stack_fffffffffffffa6c)),
             (char **)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  local_40.first_nongap = 0;
  local_41 = 0;
  Vector::appendValue((Vector *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                      in_stack_fffffffffffffa58);
  Vector::appendValue((Vector *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                      in_stack_fffffffffffffa58);
  initAlphabets(SUB81((ulong)in_stack_fffffffffffffa80 >> 0x38,0),in_stack_fffffffffffffa78,
                (bool)in_stack_fffffffffffffa77);
  uVar28 = 0;
  iVar5 = readFASTA(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                    in_stack_fffffffffffffd60,
                    (Vector *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                    in_stack_fffffffffffffd50,in_stack_fffffffffffffd90,
                    (bool)in_stack_fffffffffffffd4f,in_stack_fffffffffffffda0,
                    in_stack_fffffffffffffda8,in_stack_fffffffffffffd40,
                    (bool)in_stack_fffffffffffffd3f);
  if (iVar5 == 1) {
    local_4 = 1;
    local_58 = 1;
  }
  else {
    local_41 = 0;
    uVar21 = (byte)~local_18 & 1;
    this = &local_40;
    uVar29 = 0x3a;
    __first._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    uVar28 = 0;
    iVar5 = readFASTA(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                      in_stack_fffffffffffffd60,
                      (Vector *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                      in_stack_fffffffffffffd50,in_stack_fffffffffffffd90,
                      (bool)in_stack_fffffffffffffd4f,in_stack_fffffffffffffda0,
                      in_stack_fffffffffffffda8,in_stack_fffffffffffffd40,
                      (bool)in_stack_fffffffffffffd3f);
    if (iVar5 == 1) {
      local_4 = 1;
      local_58 = 1;
    }
    else {
      uVar6 = Vector::length(&seqLengths);
      local_60 = uVar6 - 1;
      if ((local_18 & 1) == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Read ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_60 - 1);
        poVar7 = std::operator<<(poVar7," sequences of length ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_40.first_nongap);
        poVar7 = std::operator<<(poVar7,"nt from input file ");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      uVar2 = local_60;
      local_68 = (sequence_gap_structure *)0x0;
      local_70 = 0.0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_60;
      uVar8 = SUB168(auVar1 * ZEXT816(0x20),0);
      if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      psVar9 = (sequence_gap_structure *)operator_new__(uVar8);
      if (uVar2 != 0) {
        local_420 = psVar9;
        do {
          sequence_gap_structure::sequence_gap_structure(local_420);
          local_420 = local_420 + 1;
        } while (local_420 != psVar9 + uVar2);
      }
      local_68 = psVar9;
      for (local_78 = 0; local_78 < local_60; local_78 = local_78 + 1) {
        stringText((StringBuffer *)
                   CONCAT17(in_stack_fffffffffffffa6f,
                            CONCAT16(in_stack_fffffffffffffa6e,
                                     CONCAT24(in_stack_fffffffffffffa6c,uVar21))),
                   (Vector *)CONCAT44(in_stack_fffffffffffffa64,uVar29),
                   (unsigned_long)__first._M_current);
        describe_sequence(in_stack_fffffffffffffa80,(unsigned_long)in_stack_fffffffffffffa78,
                          CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
        psVar9 = local_68 + local_78;
        psVar9->first_nongap = local_98;
        psVar9->last_nongap = local_90;
        psVar9->resolved_start = local_88;
        psVar9->resolved_end = local_80;
      }
      if ((local_18 & 1) == 0) {
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
        std::operator<<(poVar7,"Progress: ");
      }
      if (local_1c == 0) {
        local_9c = 5;
      }
      else if (local_1c == 1) {
        local_9c = 6;
      }
      else if (local_1c == 2) {
        local_9c = 0;
      }
      time(&local_a8);
      local_b8 = stringText((StringBuffer *)
                            CONCAT17(in_stack_fffffffffffffa6f,
                                     CONCAT16(in_stack_fffffffffffffa6e,
                                              CONCAT24(in_stack_fffffffffffffa6c,uVar21))),
                            (Vector *)CONCAT44(in_stack_fffffffffffffa64,uVar29),
                            (unsigned_long)__first._M_current);
      local_c0 = stringText((StringBuffer *)
                            CONCAT17(in_stack_fffffffffffffa6f,
                                     CONCAT16(in_stack_fffffffffffffa6e,
                                              CONCAT24(in_stack_fffffffffffffa6c,uVar21))),
                            (Vector *)CONCAT44(in_stack_fffffffffffffa64,uVar29),
                            (unsigned_long)__first._M_current);
      local_c8 = local_68;
      std::map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>::
      map((map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_> *
          )0x10ed6d);
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)0x10ed7a);
      std::vector<Vector_*,_std::allocator<Vector_*>_>::vector
                ((vector<Vector_*,_std::allocator<Vector_*>_> *)0x10ed87);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)0x10ed94);
      for (local_148 = 1; local_148 < local_60; local_148 = local_148 + 1) {
        if (((local_18 & 1) == 0) &&
           ((auVar24._8_4_ = (int)(local_60 >> 0x20), auVar24._0_8_ = local_60,
            auVar24._12_4_ = 0x45300000,
            0.1 < ((double)(long)local_148 * 100.0) /
                  ((auVar24._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_60) - 4503599627370496.0)) - local_70 ||
            (local_148 == local_60 - 1)))) {
          time(&local_b0);
          auVar25._8_4_ = (int)(local_60 >> 0x20);
          auVar25._0_8_ = local_60;
          auVar25._12_4_ = 0x45300000;
          local_70 = ((double)(long)local_148 * 100.0) /
                     ((auVar25._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_60) - 4503599627370496.0));
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                                  );
          local_14c = (int)std::setw(8);
          poVar7 = std::operator<<(poVar7,(_Setw)local_14c);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_70);
          poVar7 = std::operator<<(poVar7,"% (");
          local_150 = (int)std::setw(0xc);
          poVar7 = std::operator<<(poVar7,(_Setw)local_150);
          local_154 = (int)std::setprecision(3);
          poVar7 = std::operator<<(poVar7,(_Setprecision)local_154);
          dVar22 = (double)(long)local_148;
          dVar23 = difftime(local_b0,local_a8);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar22 / dVar23);
          std::operator<<(poVar7," seqs/sec)");
          local_b0 = local_a8;
        }
        pVVar10 = (Vector *)operator_new(0x18);
        Vector::Vector((Vector *)CONCAT44(in_stack_fffffffffffffa54,uVar28));
        local_160 = pVVar10;
        local_168 = stringText((StringBuffer *)
                               CONCAT17(in_stack_fffffffffffffa6f,
                                        CONCAT16(in_stack_fffffffffffffa6e,
                                                 CONCAT24(in_stack_fffffffffffffa6c,uVar21))),
                               (Vector *)CONCAT44(in_stack_fffffffffffffa64,uVar29),
                               (unsigned_long)__first._M_current);
        this = local_68 + local_148;
        computeDifferences(in_stack_fffffffffffffac0,
                           (char *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
                           in_stack_fffffffffffffab0,
                           (char)((ulong)in_stack_fffffffffffffaa8 >> 0x38),
                           in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                           in_stack_fffffffffffffad0);
        local_190 = std::
                    map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
                    ::size((map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
                            *)0x10f109);
        std::pair<Vector_*const,_long>::pair<Vector_*&,_unsigned_long,_true>
                  (&local_188,&local_160,&local_190);
        pVar26 = std::
                 map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
                 ::insert((map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
                           *)CONCAT44(in_stack_fffffffffffffa64,uVar29),
                          (value_type *)__first._M_current);
        local_1a0 = (_Base_ptr)pVar26.first._M_node;
        local_198 = pVar26.second;
        local_178 = local_1a0;
        local_170 = local_198;
        ptVar11 = std::get<1ul,std::_Rb_tree_iterator<std::pair<Vector*const,long>>,bool>
                            ((pair<std::_Rb_tree_iterator<std::pair<Vector_*const,_long>_>,_bool> *)
                             0x10f19f);
        local_1a1 = *ptVar11 & 1;
        if (local_1a1 == 0) {
          ptVar12 = std::get<0ul,std::_Rb_tree_iterator<std::pair<Vector*const,long>>,bool>
                              ((pair<std::_Rb_tree_iterator<std::pair<Vector_*const,_long>_>,_bool>
                                *)0x10f1c5);
          local_1b8 = ptVar12->_M_node;
          std::_Rb_tree_iterator<std::pair<Vector_*const,_long>_>::operator*
                    ((_Rb_tree_iterator<std::pair<Vector_*const,_long>_> *)0x10f1dd);
          puVar13 = (ulong *)std::get<1ul,Vector*const,long>((pair<Vector_*const,_long> *)0x10f1e5);
          local_1b0 = *puVar13;
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)
                     CONCAT44(in_stack_fffffffffffffa64,uVar29),
                     (value_type_conflict *)__first._M_current);
          pVVar10 = local_160;
          if (local_160 != (Vector *)0x0) {
            Vector::~Vector((Vector *)0x10f22a);
            operator_delete(pVVar10,0x18);
          }
        }
        else {
          sVar14 = std::
                   map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
                   ::size((map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
                           *)0x10f281);
          local_1b0 = sVar14 - 1;
          sVar14 = std::
                   map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
                   ::size((map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
                           *)0x10f299);
          local_1c0 = sVar14 - 1;
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)
                     CONCAT44(in_stack_fffffffffffffa54,uVar28),&this->first_nongap);
          std::vector<Vector_*,_std::allocator<Vector_*>_>::push_back
                    ((vector<Vector_*,_std::allocator<Vector_*>_> *)
                     CONCAT44(in_stack_fffffffffffffa64,uVar29),(value_type *)__first._M_current);
        }
        uVar2 = local_1b0;
        sVar15 = std::
                 vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ::size(&local_140);
        if (sVar15 <= uVar2) {
          std::vector<long,_std::allocator<long>_>::vector
                    ((vector<long,_std::allocator<long>_> *)0x10f316);
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffa64,uVar29),(value_type *)__first._M_current
                     );
          std::vector<long,_std::allocator<long>_>::~vector
                    ((vector<long,_std::allocator<long>_> *)
                     CONCAT44(in_stack_fffffffffffffa64,uVar29));
        }
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::operator[](&local_140,local_1b0);
        std::vector<long,_std::allocator<long>_>::push_back
                  ((vector<long,_std::allocator<long>_> *)CONCAT44(in_stack_fffffffffffffa64,uVar29)
                   ,(value_type_conflict *)__first._M_current);
      }
      if ((local_20 == 0) && ((local_17 & 1) != 0)) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *)0x10f3cd);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x10f3da);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x10f3e7);
        local_240 = local_128;
        local_248._M_current =
             (Vector **)
             std::vector<Vector_*,_std::allocator<Vector_*>_>::begin
                       ((vector<Vector_*,_std::allocator<Vector_*>_> *)this);
        std::vector<Vector_*,_std::allocator<Vector_*>_>::end
                  ((vector<Vector_*,_std::allocator<Vector_*>_> *)this);
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<Vector_**,_std::vector<Vector_*,_std::allocator<Vector_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffa54,uVar28),
                                  (__normal_iterator<Vector_**,_std::vector<Vector_*,_std::allocator<Vector_*>_>_>
                                   *)this), bVar3) {
          ppVVar16 = __gnu_cxx::
                     __normal_iterator<Vector_**,_std::vector<Vector_*,_std::allocator<Vector_*>_>_>
                     ::operator*(&local_248);
          pVVar10 = *ppVVar16;
          std::vector<long,_std::allocator<long>_>::vector
                    ((vector<long,_std::allocator<long>_> *)0x10f464);
          for (local_278 = 0; uVar6 = Vector::length(pVVar10), local_278 < uVar6;
              local_278 = local_278 + 1) {
            std::__cxx11::string::string((string *)&stack0xfffffffffffffd68);
            diff = Vector::value(pVVar10,local_278);
            unpack_difference(diff,(long *)&stack0xfffffffffffffd60,(uint *)&stack0xfffffffffffffd5c
                             );
            std::__cxx11::to_string((long)in_stack_fffffffffffffa98);
            std::__cxx11::string::operator+=((string *)&stack0xfffffffffffffd68,local_2c8);
            std::__cxx11::string::~string(local_2c8);
            cVar4 = unmap_char((uchar)in_stack_fffffffffffffd5c,false);
            std::__cxx11::string::operator+=((string *)&stack0xfffffffffffffd68,cVar4);
            local_308 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                        ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                *)0x10f577);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long,_true>
                      ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                        *)CONCAT44(in_stack_fffffffffffffa64,uVar29),__first._M_current,
                       (unsigned_long *)CONCAT44(in_stack_fffffffffffffa54,uVar28));
            pVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                               *)CONCAT44(in_stack_fffffffffffffa64,uVar29),
                              (value_type *)__first._M_current);
            local_318 = (_Base_ptr)pVar27.first._M_node;
            local_310 = pVar27.second;
            local_2d8 = local_318;
            local_2d0 = local_310;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
            ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                     *)0x10f60d);
            ptVar11 = std::
                      get<1ul,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,long>>,bool>
                                ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_bool>
                                  *)0x10f61a);
            local_319 = *ptVar11 & 1;
            if (local_319 == 0) {
              ptVar18 = std::
                        get<0ul,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,long>>,bool>
                                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_bool>
                                    *)0x10f6f0);
              local_330 = ptVar18->_M_node;
              std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
              ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                           *)0x10f708);
              ptVar19 = std::get<1ul,std::__cxx11::string_const,long>
                                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                                    *)0x10f710);
              local_328 = *ptVar19;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffa64,uVar29),__first._M_current);
              sVar17 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                       ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                               *)0x10f657);
              local_328 = sVar17 - 1;
            }
            std::vector<long,_std::allocator<long>_>::push_back
                      ((vector<long,_std::allocator<long>_> *)
                       CONCAT44(in_stack_fffffffffffffa64,uVar29),
                       (value_type_conflict *)__first._M_current);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
          }
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffa64,uVar29),(value_type *)__first._M_current
                     );
          std::vector<long,_std::allocator<long>_>::~vector
                    ((vector<long,_std::allocator<long>_> *)
                     CONCAT44(in_stack_fffffffffffffa64,uVar29));
          __gnu_cxx::__normal_iterator<Vector_**,_std::vector<Vector_*,_std::allocator<Vector_*>_>_>
          ::operator++(&local_248);
        }
        fprintf((FILE *)local_40.resolved_end,"{\"reference\":\"");
        __f_01.args = (args_t *)0x0;
        dump_fasta(in_stack_fffffffffffffa80,(long)in_stack_fffffffffffffa78,
                   (FILE *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
                   (bool)in_stack_fffffffffffffa6f,(bool)in_stack_fffffffffffffa6e,
                   CONCAT44(in_stack_fffffffffffffa64,uVar29),in_stack_fffffffffffffa90);
        fprintf((FILE *)local_40.resolved_end,"\",\"mutations\" : [");
        local_338._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__f_01.args);
        __stream = (FILE *)local_40.resolved_end;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_338);
        uVar20 = std::__cxx11::string::c_str();
        fprintf(__stream,"\"%s\"",uVar20);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)__first._M_current,in_stack_fffffffffffffa54);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__f_01.args);
        __last._M_current._4_4_ = in_stack_fffffffffffffa54;
        __last._M_current._0_4_ = uVar28;
        std::
        for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,main::__0>
                  (__first,__last,__f_01);
        fprintf((FILE *)local_40.resolved_end,"], \"patterns\" : [");
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)__f_01.args);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)__f_01.args);
        __last_00._M_current._4_4_ = in_stack_fffffffffffffa54;
        __last_00._M_current._0_4_ = uVar28;
        __f.args = __f_01.args;
        __f.comma = (bool *)0x10f994;
        std::
        for_each<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,main::__1>
                  ((__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                    )__first._M_current,__last_00,__f);
        fprintf((FILE *)local_40.resolved_end,"], \"sequences\" : [");
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)__f_01.args);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)__f_01.args);
        __last_01._M_current._4_4_ = in_stack_fffffffffffffa54;
        __last_01._M_current._0_4_ = uVar28;
        __f_00.args = __f_01.args;
        __f_00.comma = (bool *)0x10fa49;
        std::
        for_each<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,main::__2>
                  ((__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                    )__first._M_current,__last_01,__f_00);
        fprintf((FILE *)local_40.resolved_end,"]}");
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffa64,uVar29));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffa64,uVar29));
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                *)0x10faac);
      }
      if (local_68 != (sequence_gap_structure *)0x0) {
        operator_delete__(local_68);
      }
      local_4 = 0;
      local_58 = 1;
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffa64,uVar29));
      std::vector<Vector_*,_std::allocator<Vector_*>_>::~vector
                ((vector<Vector_*,_std::allocator<Vector_*>_> *)
                 CONCAT44(in_stack_fffffffffffffa64,uVar29));
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)CONCAT44(in_stack_fffffffffffffa64,uVar29));
      std::map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>::
      ~map((map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
            *)0x10fb54);
    }
  }
  argparse::args_t::~args_t((args_t *)CONCAT44(in_stack_fffffffffffffa54,uVar28));
  return local_4;
}

Assistant:

int main(int argc, const char *argv[]) {
  args_t args = args_t(argc, argv);

  long firstSequenceLength = 0;

  char automatonState = 0;
  // 0 - between sequences
  // 1 - reading sequence name
  // 2 - reading sequence

  nameLengths.appendValue(0);
  seqLengths.appendValue(0);

  initAlphabets(false, NULL);
  if (readFASTA(args.reference, automatonState, names, sequences, nameLengths,
                  seqLengths, firstSequenceLength) == 1)
    return 1;
    
  automatonState = 0;
    
    
  if (readFASTA(args.input, automatonState, names, sequences, nameLengths,
                seqLengths, firstSequenceLength, false, NULL, ':', 1.0, !args.quiet) == 1)
    return 1;

  unsigned long sequenceCount = seqLengths.length() - 1;

  if (!args.quiet) {
      cerr << "Read " << sequenceCount - 1 << " sequences of length " << firstSequenceLength <<"nt from input file " << endl;
  }

  sequence_gap_structure *sequence_descriptors = NULL;

  double percentDone = 0.;

  sequence_descriptors = new sequence_gap_structure[sequenceCount];
  for (unsigned long sid = 0UL; sid < sequenceCount; sid++) {
    sequence_descriptors[sid] = describe_sequence(
        stringText(sequences, seqLengths, sid), firstSequenceLength);
  }

  if (!args.quiet)
    cerr << endl << "Progress: ";

  int resolutionOption;
  switch (args.ambig) {
  case resolve:
    resolutionOption = RESOLVE;
    break;
  case all:
    resolutionOption = MISMATCH;
    break;
  case informative:
    resolutionOption = INFORMATIVE;
    break;
  }

  time_t before, after;
  time(&before);

  const char *ref_name = stringText(names, nameLengths, 0),
             *ref_seq = stringText(sequences, seqLengths, 0);
    
  const sequence_gap_structure *ref_gaps = &sequence_descriptors[0];
    
  std::map <Vector*, long, cmpMatchPatterns> pattern_map;
  std::vector <long> assignments;
  std::vector <Vector*> patterns;
  std::vector <std::vector<long>> copies;
    
    
  for (long seq_id = 1L; seq_id < sequenceCount; seq_id ++) {
      
      if (!args.quiet && (seq_id * 100. / sequenceCount - percentDone > 0.1 ||
                          seq_id == (long)sequenceCount - 1)) {
        {
          time(&after);
          percentDone = seq_id * 100. / sequenceCount;
          cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress"
                  ":"
               << setw(8) << percentDone << "% (" << setw(12) << std::setprecision(3)
               << seq_id / difftime(after, before) << " seqs/sec)";

          after = before;
        }
      }
      
      Vector* differences = new Vector;
      const char *seq_data = stringText(sequences, seqLengths, seq_id);

      computeDifferences(ref_seq, seq_data, firstSequenceLength, resolutionOption, *differences, ref_gaps, &sequence_descriptors[seq_id]);
      
      auto intert_result = pattern_map.insert({differences, pattern_map.size()});
      bool did_insert = std::get<1>(intert_result);
      long my_code;
      if (!did_insert) {
          auto value = std::get<0>(intert_result);
          my_code = std::get<1>(*value);
          assignments.push_back(my_code);
          delete differences;
      } else {
          my_code = pattern_map.size()-1;
          assignments.push_back(pattern_map.size()-1);
          patterns.push_back (differences);
      }
      if (my_code >= copies.size()) {
          std::vector<long> new_vector;
          copies.push_back (new_vector);
      }
      copies[my_code].push_back(seq_id);
  }
    
  
    
  if (args.out_format == json) {
      if (args.compress) {
          std::map <std::string, long> differences_map;
          std::vector <std::string> unique_differences;
          std::vector <std::vector<long>> recoded_patterns;
          
          for (Vector* p : patterns) {
              std::vector <long> recoded;
              for (long i = 0; i < p->length(); i++) {
                  std::string mut;
                  long     position;
                  unsigned character;
                  unpack_difference(p->value (i), position, character);
                  mut += to_string(position+1);
                  mut += unmap_char(character);
                  auto intert_result = differences_map.insert({mut, differences_map.size()});
                  bool did_insert = std::get<1>(intert_result);
                  long index;
                  if (did_insert) {
                      unique_differences.push_back (mut);
                      //cout << mut << endl;
                      index = differences_map.size() - 1;
                  } else {
                      auto value = std::get<0>(intert_result);
                      index = std::get<1>(*value);
                  }
                  recoded.push_back (index);
              }
              recoded_patterns.push_back (recoded);
          }
          
          // write out mutational codes
          fprintf (args.output, "{\"reference\":\"");
          dump_fasta (ref_seq, firstSequenceLength, args.output, false, false,0L,0L);
          fprintf (args.output, "\",\"mutations\" : [");
          auto mutation_string = unique_differences.begin();
          fprintf (args.output, "\"%s\"", (*mutation_string).c_str());
          mutation_string ++;
          std::for_each(mutation_string, unique_differences.end(), [&](const std::string& s) {fprintf (args.output,",\"%s\"",s.c_str()); });
          fprintf (args.output, "], \"patterns\" : [");
          bool comma = false;
          std::for_each(recoded_patterns.begin(), recoded_patterns.end(),[&](const std::vector<long>& pattern) {
              if (comma) fprintf (args.output, ",");
              long comma_inner = false;
              fprintf (args.output, "[");
              std::for_each(pattern.begin(), pattern.end(), [&](const long mi) {
                  if (comma_inner) fprintf (args.output, ",");
                  fprintf (args.output, "%ld", mi);
                  comma_inner = true;
              });
              fprintf (args.output, "]");
              comma = true;
          });
          fprintf (args.output, "], \"sequences\" : [");
          comma = false;
          std::for_each(copies.begin(), copies.end(),[&](const std::vector<long>& pattern) {
              if (comma) fprintf (args.output, ",");
              long comma_inner = false;
              fprintf (args.output, "[");
              std::for_each(pattern.begin(), pattern.end(), [&](const long mi) {
                  if (comma_inner) fprintf (args.output, ",");
                  fprintf (args.output, "\"%s\"", stringText(names, nameLengths, mi));
                  comma_inner = true;
              });
              fprintf (args.output, "]");
              comma = true;
          });
          fprintf (args.output, "]}");
      }
      
      /*for (std::vector<long> c: copies ) {
          cout << c.size() << endl;
      }*/
      
      
  }
    
  delete [] sequence_descriptors;
  return 0;
}